

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O1

void __thiscall
duckdb::BinaryAggregateHeap<float,_float,_duckdb::GreaterThan>::Insert
          (BinaryAggregateHeap<float,_float,_duckdb::GreaterThan> *this,ArenaAllocator *allocator,
          float *key,float *value)

{
  STORAGE_TYPE *pSVar1;
  idx_t iVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  STORAGE_TYPE local_68;
  ulong local_60;
  float *local_58;
  float *local_50;
  STORAGE_TYPE local_48;
  undefined8 uStack_40;
  
  pSVar1 = this->heap;
  uVar7 = this->size;
  if (uVar7 < this->capacity) {
    pSVar1[uVar7].first.value = *key;
    pSVar1[uVar7].second.value = *value;
    this->size = uVar7 + 1;
    local_68 = pSVar1[uVar7];
    if (1 < (long)(uVar7 + 1)) {
      do {
        uVar8 = (long)((uVar7 - ((long)(uVar7 - 1) >> 0x3f)) + -1) >> 1;
        bVar3 = duckdb::GreaterThan::Operation<float>((float *)(pSVar1 + uVar8),(float *)&local_68);
        if (!bVar3) break;
        pSVar1[uVar7] = pSVar1[uVar8];
        bVar3 = 2 < (long)uVar7;
        uVar7 = uVar8;
      } while (bVar3);
    }
    pSVar1[uVar7].first.value = local_68.first.value;
    pSVar1[uVar7].second.value = local_68.second.value;
  }
  else {
    bVar3 = duckdb::GreaterThan::Operation<float>(key,(float *)pSVar1);
    if (bVar3) {
      iVar2 = this->size;
      if (1 < (long)iVar2) {
        pSVar1 = this->heap;
        local_48 = pSVar1[iVar2 - 1];
        uStack_40 = 0;
        pSVar1[iVar2 - 1] = *pSVar1;
        local_60 = iVar2 * 8 - 8;
        lVar6 = (long)local_60 >> 3;
        local_58 = key;
        local_50 = value;
        if (lVar6 < 3) {
          lVar4 = 0;
        }
        else {
          lVar5 = 0;
          do {
            bVar3 = duckdb::GreaterThan::Operation<float>
                              ((float *)(pSVar1 + lVar5 * 2 + 2),(float *)(pSVar1 + lVar5 * 2 + 1));
            if (bVar3) {
              lVar4 = lVar5 * 2 + 1;
            }
            else {
              lVar4 = lVar5 * 2 + 2;
            }
            pSVar1[lVar5] = pSVar1[lVar4];
            lVar5 = lVar4;
          } while (lVar4 < (lVar6 - (lVar6 + -1 >> 0x3f)) + -1 >> 1);
        }
        if (((local_60 & 8) == 0) && (lVar4 == lVar6 + -2 >> 1)) {
          pSVar1[lVar4] = pSVar1[lVar4 * 2 + 1];
          lVar4 = lVar4 * 2 + 1;
        }
        local_68 = local_48;
        if (0 < lVar4) {
          do {
            lVar6 = (lVar4 - (lVar4 + -1 >> 0x3f)) + -1 >> 1;
            bVar3 = duckdb::GreaterThan::Operation<float>
                              ((float *)(pSVar1 + lVar6),(float *)&local_68);
            if (!bVar3) break;
            pSVar1[lVar4] = pSVar1[lVar6];
            bVar3 = 2 < lVar4;
            lVar4 = lVar6;
          } while (bVar3);
        }
        pSVar1[lVar4].first.value = local_68.first.value;
        pSVar1[lVar4].second.value = local_68.second.value;
        value = local_50;
        key = local_58;
      }
      pSVar1 = this->heap;
      iVar2 = this->size;
      pSVar1[iVar2 - 1].first.value = *key;
      pSVar1[iVar2 - 1].second.value = *value;
      local_68 = pSVar1[iVar2 - 1];
      lVar4 = (long)(iVar2 * 8) >> 3;
      lVar6 = lVar4 + -1;
      if (1 < lVar4) {
        do {
          lVar4 = (lVar6 - (lVar6 + -1 >> 0x3f)) + -1 >> 1;
          bVar3 = duckdb::GreaterThan::Operation<float>
                            ((float *)(pSVar1 + lVar4),(float *)&local_68);
          if (!bVar3) break;
          pSVar1[lVar6] = pSVar1[lVar4];
          bVar3 = 2 < lVar6;
          lVar6 = lVar4;
        } while (bVar3);
      }
      pSVar1[lVar6].first.value = local_68.first.value;
      pSVar1[lVar6].second.value = local_68.second.value;
    }
  }
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}